

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

bool testing::internal::ParameterizedTestSuiteInfo<Base64Test>::IsValidParamName(string *name)

{
  ulong uVar1;
  byte *pbVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar1 = name->_M_string_length;
  if (uVar1 != 0) {
    pbVar2 = (byte *)(name->_M_dataplus)._M_p;
    uVar6 = (uint)*pbVar2;
    iVar4 = isalnum(uVar6);
    if ((uVar6 == 0x5f) || (iVar4 != 0)) {
      uVar3 = 1;
      do {
        uVar5 = uVar3;
        if (uVar1 == uVar5) break;
        uVar6 = (uint)pbVar2[uVar5];
        iVar4 = isalnum(uVar6);
        uVar3 = uVar5 + 1;
      } while ((uVar6 == 0x5f) || (iVar4 != 0));
      return uVar1 <= uVar5;
    }
  }
  return false;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }